

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RsIfElseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RsIfElseSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::RsProdItemSyntax&,slang::syntax::RsElseClauseSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          RsProdItemSyntax *args_4,RsElseClauseSyntax **args_5)

{
  Token closeParen;
  RsIfElseSyntax *this_00;
  RsElseClauseSyntax *in_RCX;
  Token *in_RDX;
  long in_RSI;
  RsProdItemSyntax *in_R8;
  Info *in_R9;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  this_00 = (RsIfElseSyntax *)
            allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  closeParen.info = in_R9;
  closeParen._0_8_ = *(undefined8 *)(in_RSI + 8);
  slang::syntax::RsIfElseSyntax::RsIfElseSyntax
            (this_00,*in_RDX,*(Token *)&(in_R8->super_RsProdSyntax).super_SyntaxNode,
             (ExpressionSyntax *)in_stack_ffffffffffffff88,closeParen,in_R8,in_RCX);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }